

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

void __thiscall pm::Sampler::setupShuffleIndices(Sampler *this)

{
  result_type_conflict rVar1;
  iterator __first;
  iterator __last;
  reference __x;
  uint local_2764;
  uint i_1;
  uint local_2750;
  value_type_conflict local_274c;
  uint p;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  undefined1 local_2720 [8];
  mt19937 g;
  random_device rd;
  Sampler *this_local;
  
  std::random_device::random_device((random_device *)&g._M_p);
  rVar1 = std::random_device::operator()((random_device *)&g._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->shuffledIndices_,(ulong)(this->numSamples_ * this->numSets_));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p,(ulong)this->numSamples_);
  for (local_274c = 0; local_274c < this->numSamples_; local_274c = local_274c + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p,&local_274c);
  }
  for (local_2750 = 0; local_2750 < this->numSets_; local_2750 = local_2750 + 1) {
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
    std::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_2720);
    for (local_2764 = 0; local_2764 < this->numSamples_; local_2764 = local_2764 + 1) {
      __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p,(ulong)local_2764);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->shuffledIndices_,__x);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
  std::random_device::~random_device((random_device *)&g._M_p);
  return;
}

Assistant:

void Sampler::setupShuffleIndices()
{
	std::random_device rd;
	std::mt19937 g(rd());

	shuffledIndices_.reserve(numSamples_ * numSets_);
	std::vector<unsigned int> indices;
	indices.reserve(numSamples_);

	for (unsigned int i = 0; i < numSamples_; i++)
		indices.push_back(i);

	for (unsigned int p = 0; p < numSets_; p++)
	{
		std::shuffle(indices.begin(), indices.end(), g);

		for (unsigned int i = 0; i < numSamples_; i++)
			shuffledIndices_.push_back(indices[i]);
	}
}